

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm2js.h
# Opt level: O1

void __thiscall wasm::Wasm2JSBuilder::addExports(Wasm2JSBuilder *this,Ref ast,Module *wasm)

{
  Export *pEVar1;
  __uniq_ptr_impl<wasm::Memory,_std::default_delete<wasm::Memory>_> _Var2;
  size_t sVar3;
  long *plVar4;
  Ref value;
  undefined8 *puVar5;
  ostream *poVar6;
  size_t sVar7;
  Value *this_00;
  Value *this_01;
  Ref RVar8;
  Value *pVVar9;
  Ref RVar10;
  Ref RVar11;
  uint uVar12;
  char *pcVar13;
  void *pvVar14;
  Ref in_R8;
  pointer puVar15;
  IString op;
  IString key;
  IString key_00;
  IString key_01;
  IString key_02;
  IString key_03;
  IString key_04;
  IString key_05;
  IString key_06;
  Name name;
  IString IVar16;
  IString name_00;
  IString IVar17;
  string_view sVar18;
  undefined1 auVar19 [16];
  string_view sVar20;
  anon_union_16_6_a0c44491_for_Value_2 aVar21;
  undefined1 local_248 [8];
  Ref block;
  ostream local_238 [96];
  ios_base local_1d8 [280];
  long *local_c0;
  long local_b0 [2];
  pointer local_a0;
  string_view local_98;
  Module *local_88;
  Value *local_80;
  pointer local_78;
  char *pcStack_70;
  Ref local_60;
  Ref block_1;
  
  value = cashew::ValueBuilder::makeObject();
  puVar15 = (wasm->exports).
            super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  local_a0 = (wasm->exports).
             super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
  local_88 = wasm;
  RVar11.inst = ast.inst;
  if (puVar15 != local_a0) {
    do {
      local_80 = RVar11.inst;
      pEVar1 = (puVar15->_M_t).
               super___uniq_ptr_impl<wasm::Export,_std::default_delete<wasm::Export>_>._M_t.
               super__Tuple_impl<0UL,_wasm::Export_*,_std::default_delete<wasm::Export>_>.
               super__Head_base<0UL,_wasm::Export_*,_false>._M_head_impl;
      uVar12 = pEVar1->kind + Table;
      if (5 < uVar12) goto switchD_0013e4fd_default;
      pcVar13 = (char *)((long)&switchD_0013e4fd::switchdataD_00185080 +
                        (long)(int)(&switchD_0013e4fd::switchdataD_00185080)[uVar12]);
      switch(pEVar1->kind) {
      case Function:
        IVar17 = fromName(this,(IString)(pEVar1->name).super_IString,Export);
        local_78 = (pointer)IVar17.str._M_len;
        sVar18 = (string_view)
                 fromName(this,(Name)(((puVar15->_M_t).
                                       super___uniq_ptr_impl<wasm::Export,_std::default_delete<wasm::Export>_>
                                       ._M_t.
                                       super__Tuple_impl<0UL,_wasm::Export_*,_std::default_delete<wasm::Export>_>
                                       .super__Head_base<0UL,_wasm::Export_*,_false>._M_head_impl)->
                                     value).super_IString.str,Top);
        pvVar14 = (void *)0x18;
        pVVar9 = (Value *)MixedArena::allocSpace((MixedArena *)&cashew::arena,0x18,8);
        pVVar9->type = Null;
        cashew::Value::free(pVVar9,pvVar14);
        pVVar9->type = String;
        (pVVar9->field_1).str.str = sVar18;
        sVar18._M_str = IVar17.str._M_str;
        sVar18._M_len = (size_t)local_78;
        ast.inst = local_80;
        break;
      case Table:
        sVar18 = (string_view)fromName(this,(IString)(pEVar1->name).super_IString,Export);
        local_78 = FUNCTION_TABLE;
        pcStack_70 = _isBottom;
        pvVar14 = (void *)0x18;
        pVVar9 = (Value *)MixedArena::allocSpace((MixedArena *)&cashew::arena,0x18,8);
        pVVar9->type = Null;
        cashew::Value::free(pVVar9,pvVar14);
        pVVar9->type = String;
        (pVVar9->field_1).str.str._M_len = (size_t)local_78;
        (pVVar9->field_1).str.str._M_str = pcStack_70;
        break;
      case Memory:
        local_78 = puVar15;
        RVar11 = cashew::ValueBuilder::makeObject();
        RVar8 = cashew::ValueBuilder::makeObject();
        auVar19 = ::wasm::IString::interned(4,"grow",0);
        key_00.str._M_len = auVar19._8_8_;
        key_00.str._M_str = (char *)RVar8.inst;
        cashew::ValueBuilder::appendToObjectWithQuotes
                  ((ValueBuilder *)RVar11.inst,auVar19._0_8_,key_00,in_R8);
        _Var2._M_t.super__Tuple_impl<0UL,_wasm::Memory_*,_std::default_delete<wasm::Memory>_>.
        super__Head_base<0UL,_wasm::Memory_*,_false>._M_head_impl =
             (((local_88->memories).
               super__Vector_base<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>,_std::allocator<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start)->_M_t).
             super___uniq_ptr_impl<wasm::Memory,_std::default_delete<wasm::Memory>_>._M_t;
        if (*(ulong *)((long)_Var2._M_t.
                             super__Tuple_impl<0UL,_wasm::Memory_*,_std::default_delete<wasm::Memory>_>
                             .super__Head_base<0UL,_wasm::Memory_*,_false>._M_head_impl + 0x38) <
            *(ulong *)((long)_Var2._M_t.
                             super__Tuple_impl<0UL,_wasm::Memory_*,_std::default_delete<wasm::Memory>_>
                             .super__Head_base<0UL,_wasm::Memory_*,_false>._M_head_impl + 0x40)) {
          auVar19 = ::wasm::IString::interned(5,"value",0);
          pcVar13 = _visitRefAs;
          key_01.str._M_len = auVar19._8_8_;
          block_1.inst = WASM_MEMORY_GROW;
          pvVar14 = (void *)0x18;
          pVVar9 = (Value *)MixedArena::allocSpace((MixedArena *)&cashew::arena,0x18,8);
          pVVar9->type = Null;
          cashew::Value::free(pVVar9,pvVar14);
          pVVar9->type = String;
          (pVVar9->field_1).ref.inst = block_1.inst;
          (pVVar9->field_1).str.str._M_str = pcVar13;
          key_01.str._M_str = (char *)pVVar9;
          cashew::ValueBuilder::appendToObjectWithQuotes
                    ((ValueBuilder *)RVar8.inst,auVar19._0_8_,key_01,in_R8);
        }
        RVar8 = cashew::ValueBuilder::makeObject();
        auVar19 = ::wasm::IString::interned(0,"",0);
        name_00.str._M_str = auVar19._8_8_;
        name_00.str._M_len = (size_t)name_00.str._M_str;
        local_248 = (undefined1  [8])cashew::ValueBuilder::makeFunction(auVar19._0_8_,name_00);
        puVar5 = (undefined8 *)cashew::Ref::operator[]((uint)local_248);
        pcVar13 = cashew::LOAD;
        pVVar9 = (Value *)*puVar5;
        block_1.inst = BUFFER;
        pvVar14 = (void *)0x18;
        RVar10.inst = (Value *)MixedArena::allocSpace((MixedArena *)&cashew::arena,0x18,8);
        (RVar10.inst)->type = Null;
        cashew::Value::free(RVar10.inst,pvVar14);
        (RVar10.inst)->type = String;
        ((RVar10.inst)->field_1).ref.inst = block_1.inst;
        ((RVar10.inst)->field_1).str.str._M_str = pcVar13;
        RVar10 = cashew::ValueBuilder::makeReturn(RVar10);
        cashew::Value::push_back(pVVar9,RVar10);
        auVar19 = ::wasm::IString::interned(3,"get",0);
        key_02.str._M_len = auVar19._8_8_;
        key_02.str._M_str = (char *)local_248;
        cashew::ValueBuilder::appendToObjectWithQuotes
                  ((ValueBuilder *)RVar8.inst,auVar19._0_8_,key_02,in_R8);
        auVar19 = ::wasm::IString::interned(6,"buffer",0);
        key_03.str._M_len = auVar19._8_8_;
        key_03.str._M_str = (char *)RVar8.inst;
        cashew::ValueBuilder::appendToObjectWithQuotes
                  ((ValueBuilder *)RVar11.inst,auVar19._0_8_,key_03,in_R8);
        aVar21 = (anon_union_16_6_a0c44491_for_Value_2)::wasm::IString::interned(6,"Object",0);
        pvVar14 = (void *)0x18;
        block_1.inst = RVar11.inst;
        pVVar9 = (Value *)MixedArena::allocSpace((MixedArena *)&cashew::arena,0x18,8);
        pVVar9->type = Null;
        cashew::Value::free(pVVar9,pvVar14);
        pVVar9->type = String;
        pVVar9->field_1 = aVar21;
        auVar19 = ::wasm::IString::interned(6,"create",0);
        key_04.str._M_len = auVar19._8_8_;
        key_04.str._M_str = (char *)RVar8.inst;
        RVar11 = cashew::ValueBuilder::makeDot((ValueBuilder *)pVVar9,auVar19._0_8_,key_04);
        aVar21 = (anon_union_16_6_a0c44491_for_Value_2)::wasm::IString::interned(6,"Object",0);
        pvVar14 = (void *)0x18;
        pVVar9 = (Value *)MixedArena::allocSpace((MixedArena *)&cashew::arena,0x18,8);
        pVVar9->type = Null;
        cashew::Value::free(pVVar9,pvVar14);
        pVVar9->type = String;
        pVVar9->field_1 = aVar21;
        auVar19 = ::wasm::IString::interned(9,"prototype",0);
        key_05.str._M_len = auVar19._8_8_;
        key_05.str._M_str = (char *)RVar8.inst;
        RVar8 = cashew::ValueBuilder::makeDot((ValueBuilder *)pVVar9,auVar19._0_8_,key_05);
        RVar11 = cashew::ValueBuilder::makeCall(RVar11,RVar8);
        cashew::ValueBuilder::appendToCall(RVar11,block_1);
        puVar15 = local_78;
        sVar18 = (string_view)
                 fromName(this,(IString)(((local_78->_M_t).
                                          super___uniq_ptr_impl<wasm::Export,_std::default_delete<wasm::Export>_>
                                          ._M_t.
                                          super__Tuple_impl<0UL,_wasm::Export_*,_std::default_delete<wasm::Export>_>
                                          .super__Head_base<0UL,_wasm::Export_*,_false>._M_head_impl
                                         )->name).super_IString,Export);
        goto LAB_0013eb48;
      case Global:
        block_1 = cashew::ValueBuilder::makeObject();
        local_78 = puVar15;
        sVar18 = (string_view)
                 fromName(this,(Name)(((puVar15->_M_t).
                                       super___uniq_ptr_impl<wasm::Export,_std::default_delete<wasm::Export>_>
                                       ._M_t.
                                       super__Tuple_impl<0UL,_wasm::Export_*,_std::default_delete<wasm::Export>_>
                                       .super__Head_base<0UL,_wasm::Export_*,_false>._M_head_impl)->
                                     value).super_IString.str,Top);
        local_248 = (undefined1  [8])cashew::ValueBuilder::makeBlock();
        puVar5 = (undefined8 *)cashew::Ref::operator[]((uint)local_248);
        pVVar9 = (Value *)*puVar5;
        pvVar14 = (void *)0x18;
        RVar11.inst = (Value *)MixedArena::allocSpace((MixedArena *)&cashew::arena,0x18,8);
        (RVar11.inst)->type = Null;
        cashew::Value::free(RVar11.inst,pvVar14);
        (RVar11.inst)->type = String;
        ((RVar11.inst)->field_1).str.str = sVar18;
        RVar11 = cashew::ValueBuilder::makeReturn(RVar11);
        cashew::Value::push_back(pVVar9,RVar11);
        auVar19 = ::wasm::IString::interned(5,"value",0);
        IVar16.str._M_len = auVar19._8_8_;
        IVar16.str._M_str = (char *)local_248;
        cashew::ValueBuilder::appendToObjectAsGetter
                  ((ValueBuilder *)block_1.inst,auVar19._0_8_,IVar16,in_R8);
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_248);
        local_60.inst._0_1_ = 0x5f;
        poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)local_248,(char *)&local_60,1);
        std::__ostream_insert<char,std::char_traits<char>>(poVar6,sVar18._M_str,sVar18._M_len);
        std::__cxx11::stringbuf::str();
        plVar4 = local_c0;
        sVar7 = strlen((char *)local_c0);
        sVar20 = (string_view)::wasm::IString::interned(sVar7,plVar4,0);
        local_98 = sVar20;
        if (local_c0 != local_b0) {
          operator_delete(local_c0,local_b0[0] + 1);
        }
        local_60 = cashew::ValueBuilder::makeBlock();
        puVar5 = (undefined8 *)cashew::Ref::operator[]((uint)&local_60);
        pVVar9 = (Value *)*puVar5;
        pvVar14 = (void *)0x18;
        this_00 = (Value *)MixedArena::allocSpace((MixedArena *)&cashew::arena,0x18,8);
        this_00->type = Null;
        cashew::Value::free(this_00,pvVar14);
        this_00->type = String;
        (this_00->field_1).str.str = sVar18;
        sVar3 = BLOCK;
        RVar11.inst = cashew::SET.inst;
        pvVar14 = (void *)0x18;
        this_01 = (Value *)MixedArena::allocSpace((MixedArena *)&cashew::arena,0x18,8);
        this_01->type = Null;
        cashew::Value::free(this_01,pvVar14);
        this_01->type = String;
        (this_01->field_1).str.str = local_98;
        op.str._M_str = (char *)this_01;
        op.str._M_len = sVar3;
        RVar11 = cashew::ValueBuilder::makeBinary((ValueBuilder *)this_00,RVar11,op,in_R8);
        cashew::Value::push_back(pVVar9,RVar11);
        IVar16.str = (string_view)::wasm::IString::interned(5,"value",0);
        in_R8.inst = (Value *)local_98._M_str;
        cashew::ValueBuilder::appendToObjectAsSetter(block_1,IVar16,(IString)local_98,local_60);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_248);
        std::ios_base::~ios_base(local_1d8);
        puVar15 = local_78;
        sVar18 = (string_view)
                 fromName(this,(IString)(((local_78->_M_t).
                                          super___uniq_ptr_impl<wasm::Export,_std::default_delete<wasm::Export>_>
                                          ._M_t.
                                          super__Tuple_impl<0UL,_wasm::Export_*,_std::default_delete<wasm::Export>_>
                                          .super__Head_base<0UL,_wasm::Export_*,_false>._M_head_impl
                                         )->name).super_IString,Export);
        RVar11 = block_1;
LAB_0013eb48:
        key_06.str._M_len = sVar18._M_str;
        key_06.str._M_str = (char *)RVar11.inst;
        cashew::ValueBuilder::appendToObjectWithQuotes
                  ((ValueBuilder *)value.inst,(Value *)sVar18._M_len,key_06,in_R8);
        ast.inst = local_80;
        goto switchD_0013e4fd_default;
      default:
        Fatal::Fatal((Fatal *)local_248);
        std::__ostream_insert<char,std::char_traits<char>>
                  (local_238,"unsupported export type: ",0x19);
        pEVar1 = (puVar15->_M_t).
                 super___uniq_ptr_impl<wasm::Export,_std::default_delete<wasm::Export>_>._M_t.
                 super__Tuple_impl<0UL,_wasm::Export_*,_std::default_delete<wasm::Export>_>.
                 super__Head_base<0UL,_wasm::Export_*,_false>._M_head_impl;
        name.super_IString.str._M_str = pcVar13;
        name.super_IString.str._M_len = (size_t)*(char **)((long)&(pEVar1->name).super_IString + 8);
        wasm::operator<<((wasm *)local_238,*(ostream **)&(pEVar1->name).super_IString,name);
        Fatal::operator<<((Fatal *)local_248,(char (*) [2])0x18c06f);
        Fatal::~Fatal((Fatal *)local_248);
      }
      key.str._M_len = sVar18._M_str;
      key.str._M_str = (char *)pVVar9;
      cashew::ValueBuilder::appendToObjectWithQuotes
                ((ValueBuilder *)value.inst,(Value *)sVar18._M_len,key,in_R8);
switchD_0013e4fd_default:
      puVar15 = puVar15 + 1;
      RVar11.inst = local_80;
    } while (puVar15 != local_a0);
  }
  if ((local_88->memories).
      super__Vector_base<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>,_std::allocator<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      (local_88->memories).
      super__Vector_base<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>,_std::allocator<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    addMemoryFuncs(this,ast,local_88);
  }
  RVar11 = cashew::ValueBuilder::makeReturn(value);
  cashew::Value::push_back(ast.inst,RVar11);
  return;
}

Assistant:

void Wasm2JSBuilder::addExports(Ref ast, Module* wasm) {
  Ref exports = ValueBuilder::makeObject();
  for (auto& export_ : wasm->exports) {
    switch (export_->kind) {
      case ExternalKind::Function: {
        ValueBuilder::appendToObjectWithQuotes(
          exports,
          fromName(export_->name, NameScope::Export),
          ValueBuilder::makeName(fromName(export_->value, NameScope::Top)));
        break;
      }
      case ExternalKind::Memory: {
        Ref descs = ValueBuilder::makeObject();
        Ref growDesc = ValueBuilder::makeObject();
        ValueBuilder::appendToObjectWithQuotes(
          descs, IString("grow"), growDesc);
        if (wasm->memories[0]->max > wasm->memories[0]->initial) {
          ValueBuilder::appendToObjectWithQuotes(
            growDesc,
            IString("value"),
            ValueBuilder::makeName(WASM_MEMORY_GROW));
        }
        Ref bufferDesc = ValueBuilder::makeObject();
        Ref bufferGetter = ValueBuilder::makeFunction(IString(""));
        bufferGetter[3]->push_back(
          ValueBuilder::makeReturn(ValueBuilder::makeName(BUFFER)));
        ValueBuilder::appendToObjectWithQuotes(
          bufferDesc, IString("get"), bufferGetter);
        ValueBuilder::appendToObjectWithQuotes(
          descs, IString("buffer"), bufferDesc);
        Ref memory = ValueBuilder::makeCall(
          ValueBuilder::makeDot(ValueBuilder::makeName(IString("Object")),
                                IString("create")),
          ValueBuilder::makeDot(ValueBuilder::makeName(IString("Object")),
                                IString("prototype")));
        ValueBuilder::appendToCall(memory, descs);
        ValueBuilder::appendToObjectWithQuotes(
          exports, fromName(export_->name, NameScope::Export), memory);
        break;
      }
      case ExternalKind::Table: {
        ValueBuilder::appendToObjectWithQuotes(
          exports,
          fromName(export_->name, NameScope::Export),
          ValueBuilder::makeName(FUNCTION_TABLE));
        break;
      }
      case ExternalKind::Global: {
        Ref object = ValueBuilder::makeObject();

        IString identName = fromName(export_->value, NameScope::Top);

        // getter
        {
          Ref block = ValueBuilder::makeBlock();

          block[1]->push_back(
            ValueBuilder::makeReturn(ValueBuilder::makeName(identName)));

          ValueBuilder::appendToObjectAsGetter(object, IString("value"), block);
        }

        // setter
        {
          std::ostringstream buffer;
          buffer << '_' << identName;
          auto setterParam = stringToIString(buffer.str());

          auto block = ValueBuilder::makeBlock();

          block[1]->push_back(
            ValueBuilder::makeBinary(ValueBuilder::makeName(identName),
                                     SET,
                                     ValueBuilder::makeName(setterParam)));

          ValueBuilder::appendToObjectAsSetter(
            object, IString("value"), setterParam, block);
        }

        ValueBuilder::appendToObjectWithQuotes(
          exports, fromName(export_->name, NameScope::Export), object);

        break;
      }
      case ExternalKind::Tag:
      case ExternalKind::Invalid:
        Fatal() << "unsupported export type: " << export_->name << "\n";
    }
  }
  if (!wasm->memories.empty()) {
    addMemoryFuncs(ast, wasm);
  }
  ast->push_back(
    ValueBuilder::makeStatement(ValueBuilder::makeReturn(exports)));
}